

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O2

optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> * __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
::find(optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *__return_storage_ptr__,
      BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
      *this,Key<1UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
            *equal)

{
  _Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_*,_false>
  _Var1;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  curNode;
  __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  local_88;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  *local_78;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  local_70;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  local_50;
  
  local_78 = equal;
  std::
  __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_88,
                 &(this->head_).
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                );
  while (local_88._M_ptr != (element_type *)0x0) {
    _Var1._M_head_impl =
         ((local_88._M_ptr)->storage)._M_t.
         super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
         .
         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_*,_false>
         ._M_head_impl;
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::function(&local_50,less);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::function(&local_70,local_78);
    (**(code **)(*(long *)&(_Var1._M_head_impl)->
                           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
                + 0x30))(__return_storage_ptr__,_Var1._M_head_impl,pattern,&local_50,&local_70);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    if ((__return_storage_ptr__->
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
        _M_engaged != false) goto LAB_0010c77b;
    std::
    __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&local_88,
                &((local_88._M_ptr)->next).
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               );
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_true,_true>).
  _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>.
  _M_engaged = false;
LAB_0010c77b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPatternType &pattern,
        std::function<bool(const T &, const FindPatternType &)> less,
        std::function<bool(const T &, const FindPatternType &)> equal
    ) override {
        std::shared_ptr<ListNode> curNode = head_;
        while (curNode != nullptr) {
            assert(curNode->valid());
            std::optional<T> found = curNode->storage->find(pattern, less, equal);
            if (found.has_value()) {
                return found;
            }
            curNode = curNode->next;
        }
        return std::nullopt;
    }